

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ipfs.c
# Opt level: O3

CURLcode ensure_trailing_slash(char **input)

{
  CURLcode CVar1;
  size_t len;
  char *pcVar2;
  dynbuf dyn;
  dynbuf dStack_48;
  
  pcVar2 = *input;
  CVar1 = CURLE_OK;
  if (((pcVar2 != (char *)0x0) && (CVar1 = CURLE_OK, *pcVar2 != '\0')) &&
     (len = strlen(pcVar2), pcVar2[len - 1] != '/')) {
    curlx_dyn_init(&dStack_48,len + 2);
    CVar1 = curlx_dyn_addn(&dStack_48,*input,len);
    free(*input);
    *input = (char *)0x0;
    if ((CVar1 == CURLE_OK) && (CVar1 = curlx_dyn_addn(&dStack_48,"/",1), CVar1 == CURLE_OK)) {
      pcVar2 = curlx_dyn_ptr(&dStack_48);
      *input = pcVar2;
      return CURLE_OK;
    }
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  return CVar1;
}

Assistant:

static CURLcode ensure_trailing_slash(char **input)
{
  if(*input && **input) {
    size_t len = strlen(*input);
    if(((*input)[len - 1] != '/')) {
      struct curlx_dynbuf dyn;
      curlx_dyn_init(&dyn, len + 2);

      if(curlx_dyn_addn(&dyn, *input, len)) {
        Curl_safefree(*input);
        return CURLE_OUT_OF_MEMORY;
      }

      Curl_safefree(*input);

      if(curlx_dyn_addn(&dyn, "/", 1))
        return CURLE_OUT_OF_MEMORY;

      *input = curlx_dyn_ptr(&dyn);
    }
  }

  return CURLE_OK;
}